

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_rules.hpp
# Opt level: O2

void ovf::detail::parse::v2::ovf_segment_data_action<ovf::detail::parse::v2::text_value_float>::
     apply<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>,double>
               (action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *in,ovf_file *f,ovf_segment *segment,double *data)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  parser_state *ppVar5;
  long lVar6;
  double dVar7;
  string local_50;
  
  iVar2 = f->_state->current_line;
  iVar3 = f->_state->current_column;
  iVar4 = segment->valuedim;
  tao::pegtl::internal::
  action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string(&local_50,in);
  dVar7 = std::__cxx11::stod(&local_50,(size_t *)0x0);
  std::__cxx11::string::~string((string *)&local_50);
  lVar6 = (long)iVar4 * (long)iVar2 + (long)iVar3;
  ppVar5 = f->_state;
  if ((int)lVar6 < ppVar5->max_data_index) {
    data[lVar6] = dVar7;
    piVar1 = &ppVar5->current_column;
    *piVar1 = *piVar1 + 1;
  }
  return;
}

Assistant:

static void apply( const Input& in, ovf_file & f, const ovf_segment & segment, scalar * data )
            {
                int row = f._state->current_line;
                int col = f._state->current_column;

                int n_cols = segment.valuedim;

                double value = std::stod(in.string());

                int idx = col + row*n_cols;

                if( idx < f._state->max_data_index )
                {
                    data[idx] = value;
                    ++f._state->current_column;
                }
            }